

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

int png_sig_cmp(png_const_bytep sig,size_t start,size_t num_to_check)

{
  int iVar1;
  size_t __n;
  
  if (num_to_check < 9) {
    if (num_to_check == 0) {
      return -1;
    }
  }
  else {
    num_to_check = 8;
  }
  if (7 < start) {
    return -1;
  }
  __n = 8 - start;
  if (num_to_check + start < 9) {
    __n = num_to_check;
  }
  iVar1 = memcmp(sig + start,png_sig_cmp::png_signature + start,__n);
  return iVar1;
}

Assistant:

int PNGAPI
png_sig_cmp(png_const_bytep sig, size_t start, size_t num_to_check)
{
   static const png_byte png_signature[8] = {137, 80, 78, 71, 13, 10, 26, 10};

   if (num_to_check > 8)
      num_to_check = 8;

   else if (num_to_check < 1)
      return -1;

   if (start > 7)
      return -1;

   if (start + num_to_check > 8)
      num_to_check = 8 - start;

   return memcmp(&sig[start], &png_signature[start], num_to_check);
}